

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkPredict_Bootstrap
              (ARKodeMem ark_mem,realtype hj,realtype tau,int nvec,realtype *cvals,N_Vector *Xvecs,
              N_Vector yguess)

{
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  int in_ESI;
  ARKodeMem in_RDI;
  double in_XMM0_Qa;
  realtype *c;
  double in_XMM1_Qa;
  int retval;
  int i;
  realtype a2;
  realtype a1;
  realtype a0;
  N_Vector in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar1;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkPredict_Bootstrap",
                    "ARKodeMem structure is NULL");
    local_4 = -0x15;
  }
  else if (in_RDI->interp == (ARKInterp)0x0) {
    arkProcessError(in_RDI,-0x15,"ARKode","arkPredict_Bootstrap","ARKodeInterpMem structure is NULL"
                   );
    local_4 = -0x15;
  }
  else {
    c = (realtype *)(((in_XMM1_Qa * in_XMM1_Qa) / 2.0) / in_XMM0_Qa);
    for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
      in_RDX[iVar1 + 2] = (double)c * (double)in_RDX[iVar1];
      in_RCX[iVar1 + 2] = in_RCX[iVar1];
    }
    *in_RDX = 0x3ff0000000000000;
    *in_RCX = in_RDI->yn;
    in_RDX[1] = in_XMM1_Qa - (double)c;
    in_RCX[1] = in_RDI->fn;
    iVar1 = N_VLinearCombination
                      ((int)((ulong)(in_XMM1_Qa - (double)c) >> 0x20),c,
                       (N_Vector *)CONCAT44(iVar1,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff98);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = -0x1c;
    }
  }
  return local_4;
}

Assistant:

int arkPredict_Bootstrap(ARKodeMem ark_mem, realtype hj,
                         realtype tau, int nvec, realtype *cvals,
                         N_Vector *Xvecs, N_Vector yguess)
{
  realtype a0, a1, a2;
  int i, retval;

  /* verify that ark_mem and interpolation structure are provided */
  if (ark_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkPredict_Bootstrap",
                    "ARKodeMem structure is NULL");
    return(ARK_MEM_NULL);
  }
  if (ark_mem->interp == NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode",
                    "arkPredict_Bootstrap",
                    "ARKodeInterpMem structure is NULL");
    return(ARK_MEM_NULL);
  }

  /* set coefficients for Hermite interpolant */
  a0 = ONE;
  a2 = tau*tau/TWO/hj;
  a1 = tau - a2;

  /* set arrays for fused vector operation; shift inputs for
     f(t_n+hj,z_j) to end of queue */
  for (i=0; i<nvec; i++) {
    cvals[2+i] = a2*cvals[i];
    Xvecs[2+i] = Xvecs[i];
  }
  cvals[0] = a0;
  Xvecs[0] = ark_mem->yn;
  cvals[1] = a1;
  Xvecs[1] = ark_mem->fn;

  /* call fused vector operation to compute prediction */
  retval = N_VLinearCombination(nvec+2, cvals, Xvecs, yguess);
  if (retval != 0)  return(ARK_VECTOROP_ERR);
  return(ARK_SUCCESS);
}